

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

int float128_is_signaling_nan_mips(float128 a,float_status *status)

{
  bool bVar1;
  ulong uVar2;
  
  if (status->snan_bit_is_one == '\0') {
    if ((a.high & 0x7fff800000000000) != 0x7fff000000000000) goto LAB_00716af6;
    uVar2 = 0x7fffffffffff;
  }
  else {
    if ((a.high._4_4_ >> 0xf & 0xffff) < 0xffff) {
LAB_00716af6:
      bVar1 = false;
      goto LAB_00716af8;
    }
    uVar2 = 0xffffffffffff;
  }
  bVar1 = a.low != 0 || (a.high & uVar2) != 0;
LAB_00716af8:
  return (int)bVar1;
}

Assistant:

int float128_is_signaling_nan(float128 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return 0;
#else
    if (snan_bit_is_one(status)) {
        return ((a.high << 1) >= 0xFFFF000000000000ULL)
            && (a.low || (a.high & 0x0000FFFFFFFFFFFFULL));
    } else {
        return (((a.high >> 47) & 0xFFFF) == 0xFFFE)
            && (a.low || (a.high & UINT64_C(0x00007FFFFFFFFFFF)));
    }
#endif
}